

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_cde37::DepsLogTestDoubleEntry::Run(DepsLogTestDoubleEntry *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Test *pTVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  LoadStatus LVar6;
  Node *pNVar7;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  StringPiece path_03;
  StringPiece path_04;
  vector<Node_*,_std::allocator<Node_*>_> deps;
  string err;
  DepsLog log;
  stat st;
  State state;
  vector<Node_*,_std::allocator<Node_*>_> local_268;
  string local_250;
  int local_22c;
  DepsLog local_228;
  undefined1 local_1c8 [16];
  Node local_1b8;
  State local_138;
  
  State::State(&local_138);
  pTVar2 = g_current_test;
  paVar1 = &local_228.file_path_.field_2;
  local_228.needs_recompaction_ = false;
  local_228.file_ = (FILE *)0x0;
  local_228.file_path_._M_string_length = 0;
  local_228.file_path_.field_2._M_local_buf[0] = '\0';
  local_228.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_250._M_string_length = 0;
  local_250.field_2._M_local_buf[0] = '\0';
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_228.file_path_._M_dataplus._M_p = (pointer)paVar1;
  local_1c8._0_8_ = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"DepsLogTest-tempfile","");
  bVar3 = DepsLog::OpenForWrite(&local_228,(string *)local_1c8,&local_250);
  testing::Test::Check
            (pTVar2,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
             ,0x85,"log.OpenForWrite(kTestFilename, &err)");
  if ((Node *)local_1c8._0_8_ != &local_1b8) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8.path_._M_dataplus._M_p + 1));
  }
  pTVar2 = g_current_test;
  iVar5 = std::__cxx11::string::compare((char *)&local_250);
  bVar3 = testing::Test::Check
                    (pTVar2,iVar5 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x86,"\"\" == err");
  if (!bVar3) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    bVar3 = false;
    goto LAB_00150957;
  }
  local_268.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_268.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_268.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  path.len_ = 5;
  path.str_ = "foo.h";
  local_1c8._0_8_ = State::GetNode(&local_138,path,0);
  std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
            ((vector<Node*,std::allocator<Node*>> *)&local_268,(Node **)local_1c8);
  path_00.len_ = 5;
  path_00.str_ = "bar.h";
  local_1c8._0_8_ = State::GetNode(&local_138,path_00,0);
  std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
            ((vector<Node*,std::allocator<Node*>> *)&local_268,(Node **)local_1c8);
  path_01.len_ = 5;
  path_01.str_ = "out.o";
  pNVar7 = State::GetNode(&local_138,path_01,0);
  DepsLog::RecordDeps(&local_228,pNVar7,1,&local_268);
  DepsLog::Close(&local_228);
  pTVar2 = g_current_test;
  iVar5 = stat("DepsLogTest-tempfile",(stat *)local_1c8);
  bVar3 = testing::Test::Check
                    (pTVar2,iVar5 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x8f,"0 == stat(kTestFilename, &st)");
  if (bVar3) {
    local_22c = (int)local_1b8.slash_bits_;
    bVar4 = testing::Test::Check
                      (g_current_test,0 < (int)local_1b8.slash_bits_,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0x91,"file_size > 0");
    bVar3 = true;
    if (!bVar4) goto LAB_0015092d;
  }
  else {
LAB_0015092d:
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    bVar3 = false;
  }
  if (local_268.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_00150957:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT71(local_250.field_2._M_allocated_capacity._1_7_,
                             local_250.field_2._M_local_buf[0]) + 1);
  }
  DepsLog::~DepsLog(&local_228);
  if (local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_138.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001d6ce0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&local_138.bindings_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_138.bindings_.bindings_._M_t);
  if (local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&local_138.pools_._M_t);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_138);
  if (bVar3) {
    State::State(&local_138);
    pTVar2 = g_current_test;
    local_228.needs_recompaction_ = false;
    local_228.file_ = (FILE *)0x0;
    local_228.file_path_._M_string_length = 0;
    local_228.file_path_.field_2._M_local_buf[0] = '\0';
    local_228.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_228.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_228.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_228.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_228.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    local_250._M_string_length = 0;
    local_250.field_2._M_local_buf[0] = '\0';
    local_228.file_path_._M_dataplus._M_p = (pointer)paVar1;
    local_1c8._0_8_ = &local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"DepsLogTest-tempfile","");
    LVar6 = DepsLog::Load(&local_228,(string *)local_1c8,&local_138,&local_250);
    testing::Test::Check
              (pTVar2,LVar6 != LOAD_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
               ,0x99,"log.Load(kTestFilename, &state, &err)");
    if ((Node *)local_1c8._0_8_ != &local_1b8) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8.path_._M_dataplus._M_p + 1));
    }
    pTVar2 = g_current_test;
    local_1c8._0_8_ = &local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"DepsLogTest-tempfile","");
    bVar3 = DepsLog::OpenForWrite(&local_228,(string *)local_1c8,&local_250);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
               ,0x9b,"log.OpenForWrite(kTestFilename, &err)");
    if ((Node *)local_1c8._0_8_ != &local_1b8) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8.path_._M_dataplus._M_p + 1));
    }
    pTVar2 = g_current_test;
    iVar5 = std::__cxx11::string::compare((char *)&local_250);
    bVar3 = testing::Test::Check
                      (pTVar2,iVar5 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0x9c,"\"\" == err");
    if (bVar3) {
      local_268.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_268.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_268.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      path_02.len_ = 5;
      path_02.str_ = "foo.h";
      local_1c8._0_8_ = State::GetNode(&local_138,path_02,0);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&local_268,(Node **)local_1c8);
      path_03.len_ = 5;
      path_03.str_ = "bar.h";
      local_1c8._0_8_ = State::GetNode(&local_138,path_03,0);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&local_268,(Node **)local_1c8);
      path_04.len_ = 5;
      path_04.str_ = "out.o";
      pNVar7 = State::GetNode(&local_138,path_04,0);
      DepsLog::RecordDeps(&local_228,pNVar7,1,&local_268);
      DepsLog::Close(&local_228);
      pTVar2 = g_current_test;
      iVar5 = stat("DepsLogTest-tempfile",(stat *)local_1c8);
      bVar3 = testing::Test::Check
                        (pTVar2,iVar5 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0xa5,"0 == stat(kTestFilename, &st)");
      if ((!bVar3) ||
         (bVar3 = testing::Test::Check
                            (g_current_test,local_22c == (int)local_1b8.slash_bits_,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                             ,0xa7,"file_size == file_size_2"), !bVar3)) {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
      if (local_268.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_268.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_268.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_268.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT71(local_250.field_2._M_allocated_capacity._1_7_,
                               local_250.field_2._M_local_buf[0]) + 1);
    }
    DepsLog::~DepsLog(&local_228);
    if (local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_138.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001d6ce0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
    ::~_Rb_tree(&local_138.bindings_.rules_._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_138.bindings_.bindings_._M_t);
    if (local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
    ::~_Rb_tree(&local_138.pools_._M_t);
    std::
    _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_138);
    return;
  }
  return;
}

Assistant:

TEST_F(DepsLogTest, DoubleEntry) {
  // Write some deps to the file and grab its size.
  int file_size;
  {
    State state;
    DepsLog log;
    string err;
    EXPECT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar.h", 0));
    log.RecordDeps(state.GetNode("out.o", 0), 1, deps);
    log.Close();

    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    file_size = (int)st.st_size;
    ASSERT_GT(file_size, 0);
  }

  // Now reload the file, and read the same deps.
  {
    State state;
    DepsLog log;
    string err;
    EXPECT_TRUE(log.Load(kTestFilename, &state, &err));

    EXPECT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar.h", 0));
    log.RecordDeps(state.GetNode("out.o", 0), 1, deps);
    log.Close();

    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    int file_size_2 = (int)st.st_size;
    ASSERT_EQ(file_size, file_size_2);
  }
}